

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ExpectedPrefixesCollector::ConsumeLine
          (ExpectedPrefixesCollector *this,StringPiece *line,string *out_error)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  StringPiece x;
  int iVar1;
  stringpiece_ssize_type sVar2;
  mapped_type *this_01;
  bool bVar3;
  string local_148;
  string local_128;
  char *local_108;
  size_type sStack_100;
  undefined1 local_f8 [8];
  StringPiece prefix;
  undefined1 local_d8 [8];
  StringPiece package;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  string *psStack_28;
  int offset;
  string *out_error_local;
  StringPiece *line_local;
  ExpectedPrefixesCollector *this_local;
  
  psStack_28 = out_error;
  out_error_local = (string *)line;
  line_local = (StringPiece *)this;
  sVar2 = StringPiece::find(line,'=',0);
  local_2c = (int)sVar2;
  bVar3 = local_2c != -1;
  if (bVar3) {
    prefix.length_ = *(stringpiece_ssize_type *)out_error_local;
    StringPiece::StringPiece
              ((StringPiece *)local_d8,*(StringPiece *)out_error_local,0,(long)local_2c);
    local_108 = *(char **)out_error_local;
    sStack_100 = out_error_local->_M_string_length;
    iVar1 = local_2c + 1;
    sVar2 = StringPiece::length((StringPiece *)out_error_local);
    x.length_ = sStack_100;
    x.ptr_ = local_108;
    StringPiece::StringPiece((StringPiece *)local_f8,x,(long)iVar1,~(long)local_2c + sVar2);
    StringPieceTrimWhitespace((StringPiece *)local_d8);
    StringPieceTrimWhitespace((StringPiece *)local_f8);
    StringPiece::ToString_abi_cxx11_(&local_128,(StringPiece *)local_f8);
    this_00 = this->prefix_map_;
    StringPiece::ToString_abi_cxx11_(&local_148,(StringPiece *)local_d8);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,&local_148);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_128);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,"Expected prefixes file line without equal sign: \'",&local_91);
    StringPiece::ToString_abi_cxx11_((string *)&package.length_,(StringPiece *)out_error_local);
    std::operator+(&local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &package.length_);
    std::operator+(&local_50,&local_70,"\'.");
    std::__cxx11::string::operator=((string *)psStack_28,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&package.length_);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  return bVar3;
}

Assistant:

bool ExpectedPrefixesCollector::ConsumeLine(
    const StringPiece& line, string* out_error) {
  int offset = line.find('=');
  if (offset == StringPiece::npos) {
    *out_error =
        string("Expected prefixes file line without equal sign: '") +
        line.ToString() + "'.";
    return false;
  }
  StringPiece package(line, 0, offset);
  StringPiece prefix(line, offset + 1, line.length() - offset - 1);
  StringPieceTrimWhitespace(&package);
  StringPieceTrimWhitespace(&prefix);
  // Don't really worry about error checking the package/prefix for
  // being valid.  Assume the file is validated when it is created/edited.
  (*prefix_map_)[package.ToString()] = prefix.ToString();
  return true;
}